

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  long lVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  type pcVar10;
  fpclass_type fVar11;
  long lVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar14;
  long *plVar15;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  uint local_2b8 [3];
  undefined3 uStack_2ab;
  int iStack_2a8;
  bool bStack_2a4;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  uint local_268 [3];
  undefined3 uStack_25b;
  int iStack_258;
  bool bStack_254;
  undefined8 local_250;
  cpp_dec_float<100U,_int,_void> *local_240;
  double local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  uint local_1f8 [3];
  undefined3 uStack_1eb;
  int iStack_1e8;
  bool bStack_1e4;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  uint local_1a8 [3];
  undefined3 uStack_19b;
  int iStack_198;
  bool bStack_194;
  undefined8 local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint local_158 [3];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  soplex *local_138;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  pointer local_88;
  pointer pnStack_80;
  pointer local_78;
  pointer pnStack_70;
  pointer local_68;
  pointer pnStack_60;
  pointer local_58;
  pointer pnStack_50;
  int local_48;
  bool local_44;
  pointer local_40;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[8] = 0;
  (pcVar1->data)._M_elems[9] = 0;
  (pcVar1->data)._M_elems[10] = 0;
  (pcVar1->data)._M_elems[0xb] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[0xc] = 0;
  (pcVar1->data)._M_elems[0xd] = 0;
  (pcVar1->data)._M_elems[0xe] = 0;
  (pcVar1->data)._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  local_240 = &__return_storage_ptr__->m_backend;
  local_130 = coScaleval;
  pcVar10 = boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < *(int *)(this + 0x38)) {
    local_238 = *(double *)(in_FS_OFFSET + -8);
    local_230 = 0;
    local_138 = this;
    do {
      plVar15 = (long *)((long)*(int *)(*(long *)(local_138 + 0x28) + 4 + local_230 * 8) * 0x28 +
                        *(long *)(local_138 + 0x20));
      local_140._0_4_ = cpp_dec_float_finite;
      local_140._4_4_ = 0x10;
      local_188 = (undefined1  [16])0x0;
      local_178 = (undefined1  [16])0x0;
      local_168 = (undefined1  [16])0x0;
      local_158[0] = 0;
      local_158[1] = 0;
      stack0xfffffffffffffeb0 = 0;
      uStack_14b = 0;
      iStack_148 = 0;
      bStack_144 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_188,0.0);
      ::soplex::infinity::__tls_init();
      local_1e0._0_4_ = cpp_dec_float_finite;
      local_1e0._4_4_ = 0x10;
      local_228 = (undefined1  [16])0x0;
      local_218 = (undefined1  [16])0x0;
      local_208 = (undefined1  [16])0x0;
      local_1f8[0] = 0;
      local_1f8[1] = 0;
      stack0xfffffffffffffe10 = 0;
      uStack_1eb = 0;
      iStack_1e8 = 0;
      bStack_1e4 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_228,local_238);
      if (0 < *(int *)((long)plVar15 + 0xc)) {
        lVar14 = 0;
        lVar12 = 0;
        do {
          lVar3 = *plVar15;
          pcVar13 = (cpp_dec_float<100U,_int,_void> *)
                    ((vecset->
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._vptr_ClassArray + (ulong)*(uint *)(lVar3 + 0x50 + lVar14) * 10);
          pcVar1 = (cpp_dec_float<100U,_int,_void> *)(lVar3 + lVar14);
          local_190._0_4_ = cpp_dec_float_finite;
          local_190._4_4_ = 0x10;
          local_1d8 = (undefined1  [16])0x0;
          local_1c8 = (undefined1  [16])0x0;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8[0] = 0;
          local_1a8[1] = 0;
          stack0xfffffffffffffe60 = 0;
          uStack_19b = 0;
          iStack_198 = 0;
          bStack_194 = false;
          v = pcVar1;
          if (((cpp_dec_float<100U,_int,_void> *)local_1d8 != pcVar13) &&
             (v = pcVar13, pcVar1 != (cpp_dec_float<100U,_int,_void> *)local_1d8)) {
            local_1d8 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_1c8 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 4);
            local_1b8 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 8);
            local_1a8._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            stack0xfffffffffffffe60 = (undefined5)uVar5;
            uStack_19b = (undefined3)((ulong)uVar5 >> 0x28);
            iStack_198 = *(int *)(lVar3 + 0x40 + lVar14);
            bStack_194 = *(bool *)(lVar3 + 0x44 + lVar14);
            local_190 = *(undefined8 *)(lVar3 + 0x48 + lVar14);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_1d8,v);
          local_2e8 = local_1d8;
          auVar6 = local_2e8;
          local_2d8 = local_1c8;
          local_2c8 = local_1b8;
          local_2b8[0] = local_1a8[0];
          local_2b8[1] = local_1a8[1];
          stack0xfffffffffffffd50 = stack0xfffffffffffffe60;
          uStack_2ab = uStack_19b;
          iStack_2a8 = iStack_198;
          bStack_2a4 = bStack_194;
          fVar11 = (fpclass_type)local_190;
          local_2a0._0_4_ = (fpclass_type)local_190;
          local_2a0._4_4_ = local_190._4_4_;
          local_2e8._0_4_ = local_1d8._0_4_;
          if ((bStack_194 == true) && (local_2e8._0_4_ != 0 || fVar11 != cpp_dec_float_finite)) {
            bStack_2a4 = false;
          }
          local_268[0] = local_1a8[0];
          local_268[1] = local_1a8[1];
          stack0xfffffffffffffda0 = stack0xfffffffffffffe60;
          uStack_25b = uStack_19b;
          local_278 = local_1b8;
          local_288 = local_1c8;
          local_298 = local_1d8;
          local_88 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pnStack_80 = (scaleval->
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          local_78 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          pnStack_70 = scaleval[1].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_68 = scaleval[1].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pnStack_60 = scaleval[1].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_58 = scaleval[2].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pnStack_50 = scaleval[2].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_48 = *(int *)&scaleval[2].
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_44 = *(bool *)((long)&scaleval[2].
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          local_40 = scaleval[3].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          iStack_258 = iStack_198;
          local_250._0_4_ = (fpclass_type)local_190;
          local_250._4_4_ = local_190._4_4_;
          bStack_254 = bStack_2a4;
          if ((bStack_2a4 != false) && (local_2e8._0_4_ != 0 || fVar11 != cpp_dec_float_finite)) {
            bStack_254 = (bool)(bStack_2a4 ^ 1);
          }
          local_2e8 = auVar6;
          if ((int)local_40 == 2 || fVar11 == cpp_dec_float_NaN) {
LAB_001408f8:
            if ((fVar11 != cpp_dec_float_NaN) && ((fpclass_type)local_140 != cpp_dec_float_NaN)) {
              iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)local_2e8,
                                 (cpp_dec_float<100U,_int,_void> *)local_188);
              fVar11 = (fpclass_type)local_2a0;
              if (0 < iVar9) {
                local_158[0] = local_2b8[0];
                local_158[1] = local_2b8[1];
                stack0xfffffffffffffeb0 = stack0xfffffffffffffd50;
                uStack_14b = uStack_2ab;
                local_168 = local_2c8;
                local_178 = local_2d8;
                local_188 = local_2e8;
                iStack_148 = iStack_2a8;
                bStack_144 = bStack_2a4;
                local_140._0_4_ = (fpclass_type)local_2a0;
                local_140._4_4_ = local_2a0._4_4_;
              }
            }
            if (((fVar11 != cpp_dec_float_NaN) && ((fpclass_type)local_1e0 != cpp_dec_float_NaN)) &&
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  ((cpp_dec_float<100U,_int,_void> *)local_2e8,
                                   (cpp_dec_float<100U,_int,_void> *)local_228), iVar9 < 0)) {
              local_1f8[0] = local_2b8[0];
              local_1f8[1] = local_2b8[1];
              stack0xfffffffffffffe10 = stack0xfffffffffffffd50;
              uStack_1eb = uStack_2ab;
              local_208 = local_2c8;
              local_218 = local_2d8;
              local_228 = local_2e8;
              iStack_1e8 = iStack_2a8;
              bStack_1e4 = bStack_2a4;
              local_1e0._0_4_ = (fpclass_type)local_2a0;
              local_1e0._4_4_ = local_2a0._4_4_;
            }
          }
          else {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_298,
                               (cpp_dec_float<100U,_int,_void> *)&local_88);
            if (0 < iVar9) {
              fVar11 = (fpclass_type)local_2a0;
              goto LAB_001408f8;
            }
          }
          lVar12 = lVar12 + 1;
          lVar14 = lVar14 + 0x54;
        } while (lVar12 < *(int *)((long)plVar15 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_2a0._0_4_ = cpp_dec_float_finite;
      local_2a0._4_4_ = 0x10;
      local_2e8 = (undefined1  [16])0x0;
      local_2d8 = (undefined1  [16])0x0;
      local_2c8 = (undefined1  [16])0x0;
      local_2b8[0] = 0;
      local_2b8[1] = 0;
      stack0xfffffffffffffd50 = 0;
      uStack_2ab = 0;
      iStack_2a8 = 0;
      bStack_2a4 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_2e8,local_238);
      if ((((fpclass_type)local_1e0 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_2a0 == cpp_dec_float_NaN)) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_228,
                             (cpp_dec_float<100U,_int,_void> *)local_2e8), iVar9 != 0)) {
        if ((fpclass_type)local_140 != cpp_dec_float_NaN) {
          local_250._0_4_ = cpp_dec_float_finite;
          local_250._4_4_ = 0x10;
          local_298 = ZEXT816(0);
          local_288 = ZEXT816(0);
          local_278 = ZEXT816(0);
          local_268[0] = 0;
          local_268[1] = 0;
          stack0xfffffffffffffda0 = 0;
          uStack_25b = 0;
          iStack_258 = 0;
          bStack_254 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_298,0.0);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_188,
                             (cpp_dec_float<100U,_int,_void> *)local_298);
          if (iVar9 == 0) goto LAB_00140aec;
        }
      }
      else {
LAB_00140aec:
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_228,1.0);
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_188,1.0);
      }
      auVar8 = local_208;
      auVar7 = local_218;
      auVar6 = local_228;
      local_128.data._M_elems[0xf]._1_3_ = uStack_1eb;
      local_128.data._M_elems._56_5_ = stack0xfffffffffffffe10;
      local_128.data._M_elems[0] = local_228._0_4_;
      local_128.data._M_elems[1] = local_228._4_4_;
      local_128.data._M_elems[2] = local_228._8_4_;
      local_128.data._M_elems[3] = local_228._12_4_;
      local_128.data._M_elems[4] = local_218._0_4_;
      local_128.data._M_elems[5] = local_218._4_4_;
      local_128.data._M_elems[6] = local_218._8_4_;
      local_128.data._M_elems[7] = local_218._12_4_;
      local_128.data._M_elems[8] = local_208._0_4_;
      local_128.data._M_elems[9] = local_208._4_4_;
      local_128.data._M_elems[10] = local_208._8_4_;
      local_128.data._M_elems[0xb] = local_208._12_4_;
      local_128.data._M_elems[0xc] = local_1f8[0];
      local_128.data._M_elems[0xd] = local_1f8[1];
      local_128.exp = iStack_1e8;
      local_128.neg = bStack_1e4;
      local_128.fpclass = (fpclass_type)local_1e0;
      local_128.prec_elem = local_1e0._4_4_;
      local_228 = auVar6;
      local_218 = auVar7;
      local_208 = auVar8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_128,(cpp_dec_float<100U,_int,_void> *)local_188);
      local_d8.data._M_elems[0] = local_128.data._M_elems[0];
      local_d8.data._M_elems[1] = local_128.data._M_elems[1];
      local_d8.data._M_elems[2] = local_128.data._M_elems[2];
      local_d8.data._M_elems[3] = local_128.data._M_elems[3];
      local_d8.data._M_elems[4] = local_128.data._M_elems[4];
      local_d8.data._M_elems[5] = local_128.data._M_elems[5];
      local_d8.data._M_elems[6] = local_128.data._M_elems[6];
      local_d8.data._M_elems[7] = local_128.data._M_elems[7];
      local_d8.data._M_elems[8] = local_128.data._M_elems[8];
      local_d8.data._M_elems[9] = local_128.data._M_elems[9];
      local_d8.data._M_elems[10] = local_128.data._M_elems[10];
      local_d8.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_d8.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_d8.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_d8.data._M_elems[0xe] = local_128.data._M_elems[0xe];
      local_d8.data._M_elems[0xf] = local_128.data._M_elems[0xf];
      local_d8.exp = local_128.exp;
      local_d8.neg = local_128.neg;
      local_d8.fpclass = local_128.fpclass;
      local_d8.prec_elem = local_128.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::calculate_sqrt(&local_d8);
      local_2a0._0_4_ = cpp_dec_float_finite;
      local_2a0._4_4_ = 0x10;
      local_2e8 = ZEXT816(0);
      local_2d8 = ZEXT816(0);
      local_2c8 = ZEXT816(0);
      local_2b8[0] = 0;
      local_2b8[1] = 0;
      stack0xfffffffffffffd50 = 0;
      uStack_2ab = 0;
      iStack_2a8 = 0;
      bStack_2a4 = false;
      local_250._0_4_ = cpp_dec_float_finite;
      local_250._4_4_ = 0x10;
      local_298 = ZEXT816(0);
      local_288 = ZEXT816(0);
      local_278 = ZEXT816(0);
      local_268[0] = 0;
      local_268[1] = 0;
      stack0xfffffffffffffda0 = 0;
      uStack_25b = 0;
      iStack_258 = 0;
      bStack_254 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_298,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_2e8,
                 (cpp_dec_float<100U,_int,_void> *)local_298,&local_d8);
      pnVar4 = (local_130->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)((long)pnVar4[local_230].m_backend.data._M_elems + 0x30);
      *(undefined8 *)puVar2 = local_2b8._0_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_2ab,stack0xfffffffffffffd50);
      puVar2 = (uint *)((long)pnVar4[local_230].m_backend.data._M_elems + 0x20);
      *(undefined8 *)puVar2 = local_2c8._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_2c8._8_8_;
      puVar2 = (uint *)((long)pnVar4[local_230].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar2 = local_2d8._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_2d8._8_8_;
      *(undefined8 *)pnVar4[local_230].m_backend.data._M_elems = local_2e8._0_8_;
      *(undefined8 *)((long)pnVar4[local_230].m_backend.data._M_elems + 8) = local_2e8._8_8_;
      pnVar4[local_230].m_backend.exp = iStack_2a8;
      pnVar4[local_230].m_backend.neg = bStack_2a4;
      pnVar4[local_230].m_backend.fpclass = (fpclass_type)local_2a0;
      pnVar4[local_230].m_backend.prec_elem = local_2a0._4_4_;
      local_250._0_4_ = cpp_dec_float_finite;
      local_250._4_4_ = 0x10;
      local_298 = (undefined1  [16])0x0;
      local_288 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_268[0] = 0;
      local_268[1] = 0;
      stack0xfffffffffffffda0 = 0;
      uStack_25b = 0;
      iStack_258 = 0;
      bStack_254 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_298,
                 (cpp_dec_float<100U,_int,_void> *)local_188,
                 (cpp_dec_float<100U,_int,_void> *)local_228);
      if ((((fpclass_type)local_250 != cpp_dec_float_NaN) &&
          (local_240->fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_298,local_240), 0 < iVar9)) {
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 0xc)
             = local_268._0_8_;
        *(ulong *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 0xe) =
             CONCAT35(uStack_25b,stack0xfffffffffffffda0);
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 8) =
             local_278._0_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 10)
             = local_278._8_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 4) =
             local_288._0_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 6) =
             local_288._8_8_;
        *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems =
             local_298._0_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_240->data)->data)._M_elems + 2) =
             local_298._8_8_;
        local_240->exp = iStack_258;
        local_240->neg = bStack_254;
        local_240->fpclass = (fpclass_type)local_250;
        local_240->prec_elem = local_250._4_4_;
      }
      local_230 = local_230 + 1;
      pcVar10 = (type)(long)*(int *)(local_138 + 0x38);
    } while (local_230 < (long)pcVar10);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)pcVar10;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}